

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O3

void __thiscall CChat::OnConsoleInit(CChat *this)

{
  IConsole *pIVar1;
  
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"say","r[text]",2,ConSay,this,"Say in chat");
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"say_team","r[text]",2,ConSayTeam,this,"Say in team chat");
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"say_self","r[text]",2,ConSaySelf,this,"Say message just for yourself");
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"whisper","i[target] r[text]",2,ConWhisper,this,"Whisper to a client in chat");
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"chat","s[text] ?i[whisper-target]",2,ConChat,this,
             "Enable chat with all/team/whisper mode");
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"+show_chat","",2,ConShowChat,this,"Show chat");
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"chat_command","s[command] ?r[args]",2,ConChatCommand,this,
             "Execute a chat command with arguments");
  return;
}

Assistant:

void CChat::OnConsoleInit()
{
	Console()->Register("say", "r[text]", CFGFLAG_CLIENT, ConSay, this, "Say in chat");
	Console()->Register("say_team", "r[text]", CFGFLAG_CLIENT, ConSayTeam, this, "Say in team chat");
	Console()->Register("say_self", "r[text]", CFGFLAG_CLIENT, ConSaySelf, this, "Say message just for yourself");
	Console()->Register("whisper", "i[target] r[text]", CFGFLAG_CLIENT, ConWhisper, this, "Whisper to a client in chat");
	Console()->Register("chat", "s[text] ?i[whisper-target]", CFGFLAG_CLIENT, ConChat, this, "Enable chat with all/team/whisper mode");
	Console()->Register("+show_chat", "", CFGFLAG_CLIENT, ConShowChat, this, "Show chat");
	Console()->Register("chat_command", "s[command] ?r[args]", CFGFLAG_CLIENT, ConChatCommand, this, "Execute a chat command with arguments");
}